

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

char * fy_tag_directive_token_handle(fy_token *fyt,size_t *lenp)

{
  char *pcVar1;
  ulong uVar2;
  
  if (fyt == (fy_token *)0x0) {
    uVar2 = 0;
    pcVar1 = (char *)0x0;
  }
  else {
    uVar2 = 0;
    pcVar1 = (char *)0x0;
    if (fyt->type == FYTT_TAG_DIRECTIVE) {
      pcVar1 = fy_atom_data(&fyt->handle);
      uVar2 = (ulong)(fyt->field_9).tag_directive.tag_length;
    }
  }
  *lenp = uVar2;
  return pcVar1;
}

Assistant:

const char *fy_tag_directive_token_handle(struct fy_token *fyt, size_t *lenp) {
    const char *ptr;

    if (!fyt || fyt->type != FYTT_TAG_DIRECTIVE) {
        *lenp = 0;
        return NULL;
    }
    ptr = fy_atom_data(&fyt->handle);
    *lenp = fyt->tag_directive.tag_length;
    return ptr;
}